

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::
~GeometryShaderLayeredRenderingBoundaryCondition
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  GeometryShaderLayeredRenderingBoundaryCondition *this_local;
  
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderLayeredRenderingBoundaryCondition_0326f380;
  if (this->m_blue_color != (uchar *)0x0) {
    if (this->m_blue_color != (uchar *)0x0) {
      operator_delete__(this->m_blue_color);
    }
    this->m_blue_color = (uchar *)0x0;
  }
  if (this->m_green_color != (uchar *)0x0) {
    if (this->m_green_color != (uchar *)0x0) {
      operator_delete__(this->m_green_color);
    }
    this->m_green_color = (uchar *)0x0;
  }
  if (this->m_red_color != (uchar *)0x0) {
    if (this->m_red_color != (uchar *)0x0) {
      operator_delete__(this->m_red_color);
    }
    this->m_red_color = (uchar *)0x0;
  }
  if (this->m_white_color != (uchar *)0x0) {
    if (this->m_white_color != (uchar *)0x0) {
      operator_delete__(this->m_white_color);
    }
    this->m_white_color = (uchar *)0x0;
  }
  std::
  vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
  ::~vector(&this->m_textures_info);
  TestCaseBase::~TestCaseBase(&this->super_TestCaseBase);
  return;
}

Assistant:

GeometryShaderLayeredRenderingBoundaryCondition::~GeometryShaderLayeredRenderingBoundaryCondition(void)
{
	if (m_blue_color)
	{
		delete[] m_blue_color;
		m_blue_color = 0;
	}

	if (m_green_color)
	{
		delete[] m_green_color;
		m_green_color = 0;
	}

	if (m_red_color)
	{
		delete[] m_red_color;
		m_red_color = 0;
	}
	if (m_white_color)
	{
		delete[] m_white_color;
		m_white_color = 0;
	}
}